

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall
smf::MidiFile::writeVLValue
          (MidiFile *this,long aValue,vector<unsigned_char,_std::allocator<unsigned_char>_> *outdata
          )

{
  pointer *ppuVar1;
  iterator iVar2;
  byte bVar3;
  ulong uVar4;
  uchar bytes [4];
  undefined4 local_1c;
  
  local_1c = 0;
  if (0xfffffff < (ulong)aValue) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: number too large to convert to VLV",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    aValue = 0xfffffff;
  }
  local_1c = CONCAT13((char)aValue,
                      CONCAT12((char)((ulong)aValue >> 7),
                               CONCAT11((char)((ulong)aValue >> 0xe),(char)((ulong)aValue >> 0x15)))
                     ) & 0x7f7f7fff;
  uVar4 = 0;
  do {
    if (*(char *)((long)&local_1c + uVar4) != '\0') goto LAB_00116484;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  uVar4 = 4;
LAB_00116484:
  if ((uint)uVar4 < 3) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      bVar3 = *(byte *)((long)&local_1c + uVar4) | 0x80;
      *(byte *)((long)&local_1c + uVar4) = bVar3;
      iVar2._M_current =
           (outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)outdata,iVar2,
                   (uchar *)((long)&local_1c + uVar4));
      }
      else {
        *iVar2._M_current = bVar3;
        ppuVar1 = &(outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  iVar2._M_current =
       (outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)outdata,iVar2,
               (uchar *)((long)&local_1c + 3));
  }
  else {
    *iVar2._M_current = local_1c._3_1_;
    ppuVar1 = &(outdata->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void MidiFile::writeVLValue(long aValue, std::vector<uchar>& outdata) {
	uchar bytes[4] = {0};

	if ((unsigned long)aValue >= (1 << 28)) {
		std::cerr << "Error: number too large to convert to VLV" << std::endl;
		aValue = 0x0FFFffff;
	}

	bytes[0] = (uchar)(((ulong)aValue >> 21) & 0x7f);  // most significant 7 bits
	bytes[1] = (uchar)(((ulong)aValue >> 14) & 0x7f);
	bytes[2] = (uchar)(((ulong)aValue >> 7)  & 0x7f);
	bytes[3] = (uchar)(((ulong)aValue)       & 0x7f);  // least significant 7 bits

	int start = 0;
	while ((start<4) && (bytes[start] == 0))  start++;

	for (int i=start; i<3; i++) {
		bytes[i] = bytes[i] | 0x80;
		outdata.push_back(bytes[i]);
	}
	outdata.push_back(bytes[3]);
}